

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O0

bool Diligent::LinuxFileSystem::PathExists(Char *strPath)

{
  int iVar1;
  char *__file;
  undefined1 local_d8 [8];
  stat StatBuff;
  allocator local_31;
  undefined1 local_30 [8];
  string path;
  Char *strPath_local;
  
  path.field_2._8_8_ = strPath;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,strPath,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  BasicFileSystem::CorrectSlashes((String *)local_30,'\0');
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_d8);
  std::__cxx11::string::~string((string *)local_30);
  return iVar1 == 0;
}

Assistant:

bool LinuxFileSystem::PathExists(const Char* strPath)
{
    std::string path{strPath};
    CorrectSlashes(path);

    struct stat StatBuff;
    return (stat(path.c_str(), &StatBuff) == 0);
}